

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O3

int write_skip(AV1_COMMON *cm,MACROBLOCKD *xd,uint8_t segment_id,MB_MODE_INFO *mi,aom_writer *w)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  FRAME_CONTEXT *pFVar4;
  short sVar5;
  ulong uVar6;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  aom_cdf_prob (*icdf) [3];
  
  if (((cm->seg).enabled == '\0') || (uVar10 = 1, ((cm->seg).feature_mask[segment_id] & 0x40) == 0))
  {
    if (xd->above_mbmi == (MB_MODE_INFO *)0x0) {
      uVar6 = 0;
    }
    else {
      uVar6 = (ulong)xd->above_mbmi->skip_txfm;
    }
    bVar1 = mi->skip_txfm;
    uVar10 = (uint)bVar1;
    if (xd->left_mbmi == (MB_MODE_INFO *)0x0) {
      uVar8 = 0;
    }
    else {
      uVar8 = (ulong)xd->left_mbmi->skip_txfm;
    }
    lVar9 = uVar8 + uVar6;
    pFVar4 = xd->tile_ctx;
    icdf = pFVar4->skip_txfm_cdfs + lVar9;
    od_ec_encode_cdf_q15(&w->ec,(uint)bVar1,*icdf,2);
    if (w->allow_update_cdf != '\0') {
      uVar2 = pFVar4->skip_txfm_cdfs[lVar9][2];
      bVar7 = (char)(uVar2 >> 4) + 4;
      uVar3 = (*icdf)[0];
      if ((char)bVar1 < '\x01') {
        sVar5 = -(uVar3 >> (bVar7 & 0x1f));
      }
      else {
        sVar5 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar7 & 0x1f));
      }
      (*icdf)[0] = sVar5 + uVar3;
      pFVar4->skip_txfm_cdfs[lVar9][2] = uVar2 + (uVar2 < 0x20);
    }
  }
  return uVar10;
}

Assistant:

static int write_skip(const AV1_COMMON *cm, const MACROBLOCKD *xd,
                      uint8_t segment_id, const MB_MODE_INFO *mi,
                      aom_writer *w) {
  if (segfeature_active(&cm->seg, segment_id, SEG_LVL_SKIP)) {
    return 1;
  } else {
    const int skip_txfm = mi->skip_txfm;
    const int ctx = av1_get_skip_txfm_context(xd);
    FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
    aom_write_symbol(w, skip_txfm, ec_ctx->skip_txfm_cdfs[ctx], 2);
    return skip_txfm;
  }
}